

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_State_Update_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Entity_State_Update_PDU::Decode
          (Entity_State_Update_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  ArticulatedPart *this_01;
  AttachedPart *this_02;
  VariableParameter *this_03;
  int iVar3;
  KRef_Ptr<KDIS::DATA_TYPE::VariableParameter> local_c8;
  KRef_Ptr<KDIS::DATA_TYPE::VariableParameter> local_b0;
  KRef_Ptr<KDIS::DATA_TYPE::VariableParameter> local_98;
  KRef_Ptr<KDIS::DATA_TYPE::VariableParameter> local_80;
  VariableParameter *local_68;
  VariableParameter *p;
  KUINT16 local_58;
  byte local_56;
  undefined1 local_55;
  KUINT8 paramTyp;
  KUINT16 pos;
  KUINT8 i;
  allocator<char> local_41;
  KString local_40;
  byte local_19;
  KDataStream *pKStack_18;
  bool ignoreHeader_local;
  KDataStream *stream_local;
  Entity_State_Update_PDU *this_local;
  
  local_19 = ignoreHeader;
  pKStack_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar3 = 0;
  if ((local_19 & 1) != 0) {
    iVar3 = 0xc;
  }
  if (0x47 < (uint)KVar1 + iVar3) {
    std::
    vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
    ::clear(&this->m_vVariableParameters);
    Header7::Decode(&this->super_Header,pKStack_18,(bool)(local_19 & 1));
    pKVar2 = DATA_TYPE::operator>>(pKStack_18,(DataTypeBase *)&this->m_EntityID);
    pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8Padding1);
    pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8NumOfVariableParams);
    pKVar2 = DATA_TYPE::operator>>(pKVar2,&(this->m_EntityLinearVelocity).super_DataTypeBase);
    pKVar2 = DATA_TYPE::operator>>(pKVar2,&(this->m_EntityLocation).super_DataTypeBase);
    pKVar2 = DATA_TYPE::operator>>(pKVar2,&(this->m_EntityOrientation).super_DataTypeBase);
    DATA_TYPE::operator>>(pKVar2,&(this->m_EntityAppearance).super_DataTypeBase);
    for (local_56 = 0; local_56 < this->m_ui8NumOfVariableParams; local_56 = local_56 + 1) {
      local_58 = KDataStream::GetCurrentWritePosition(pKStack_18);
      KDataStream::operator>>(pKStack_18,(uchar *)((long)&p + 7));
      KDataStream::SetCurrentWritePosition(pKStack_18,local_58);
      local_68 = DATA_TYPE::FactoryDecoderUser<KDIS::DATA_TYPE::VariableParameter>::FactoryDecode
                           ((uint)p._7_1_,pKStack_18);
      if (local_68 == (VariableParameter *)0x0) {
        if (p._7_1_ == 0) {
          this_01 = (ArticulatedPart *)operator_new(0x28);
          DATA_TYPE::ArticulatedPart::ArticulatedPart(this_01,pKStack_18);
          UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>::KRef_Ptr
                    (&local_98,(VariableParameter *)this_01);
          std::
          vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
          ::push_back(&this->m_vVariableParameters,&local_98);
          UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>::~KRef_Ptr(&local_98);
        }
        else if (p._7_1_ == 1) {
          this_02 = (AttachedPart *)operator_new(0x30);
          DATA_TYPE::AttachedPart::AttachedPart(this_02,pKStack_18);
          UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>::KRef_Ptr
                    (&local_b0,(VariableParameter *)this_02);
          std::
          vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
          ::push_back(&this->m_vVariableParameters,&local_b0);
          UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>::~KRef_Ptr(&local_b0);
        }
        else {
          this_03 = (VariableParameter *)operator_new(0x18);
          DATA_TYPE::VariableParameter::VariableParameter(this_03,pKStack_18);
          UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>::KRef_Ptr(&local_c8,this_03);
          std::
          vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
          ::push_back(&this->m_vVariableParameters,&local_c8);
          UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>::~KRef_Ptr(&local_c8);
        }
      }
      else {
        UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>::KRef_Ptr(&local_80,local_68);
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
        ::push_back(&this->m_vVariableParameters,&local_80);
        UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>::~KRef_Ptr(&local_80);
      }
    }
    return;
  }
  local_55 = 1;
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Decode",&local_41);
  KException::KException(this_00,&local_40,2);
  local_55 = 0;
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Entity_State_Update_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < ENTITY_STATE_UPDATE_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vVariableParameters.clear();

    Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_EntityID
           >> m_ui8Padding1
           >> m_ui8NumOfVariableParams
           >> KDIS_STREAM m_EntityLinearVelocity
           >> KDIS_STREAM m_EntityLocation
           >> KDIS_STREAM m_EntityOrientation
           >> KDIS_STREAM m_EntityAppearance;

    for( KUINT8 i = 0; i < m_ui8NumOfVariableParams; ++i )
    {
        // Save the current write position so we can peek.
        KUINT16 pos = stream.GetCurrentWritePosition();
        KUINT8 paramTyp;

        // Extract the  type then reset the stream.
        stream >> paramTyp;
        stream.SetCurrentWritePosition( pos );

        // Use the factory decoder.
        VariableParameter * p = VariableParameter::FactoryDecode( paramTyp, stream );

        // Did we find a custom decoder? if not then use the default.
        if( p )
        {
            m_vVariableParameters.push_back( VarPrmPtr( p ) );
        }
        else
        {
            // Default internals
            switch( paramTyp )
            {
                case ArticulatedPartType:
                    m_vVariableParameters.push_back( VarPrmPtr( new ArticulatedPart( stream ) ) );
                    break;

                case AttachedPartType:
                    m_vVariableParameters.push_back( VarPrmPtr( new AttachedPart( stream ) ) );
                    break;

                default:
                    m_vVariableParameters.push_back( VarPrmPtr( new VariableParameter( stream ) ) );
                    break;
            }
        }
    }
}